

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val-req.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonArrayValReq::JsonArrayValReq
          (JsonArrayValReq *this,optional<unsigned_long_long> *minSize,
          optional<unsigned_long_long> *maxSize,Sp *elemValReq)

{
  bool bVar1;
  reference_const_type puVar2;
  unsigned_long_long local_98;
  unsigned_long_long local_80;
  JsonValKind local_44;
  type local_40;
  Sp *local_38;
  Sp *elemValReq_local;
  optional<unsigned_long_long> *maxSize_local;
  optional<unsigned_long_long> *minSize_local;
  JsonArrayValReq *this_local;
  optional<unsigned_long_long> *local_10;
  
  local_44 = Array;
  local_38 = elemValReq;
  elemValReq_local = (Sp *)maxSize;
  maxSize_local = minSize;
  minSize_local = (optional<unsigned_long_long> *)this;
  boost::optional<yactfr::internal::JsonValKind>::optional
            ((optional<yactfr::internal::JsonValKind> *)&local_40,&local_44);
  JsonValReq::JsonValReq
            (&this->super_JsonValReq,(optional<yactfr::internal::JsonValKind>)local_40,false);
  (this->super_JsonValReq)._vptr_JsonValReq = (_func_int **)&PTR__JsonArrayValReq_007e0698;
  local_10 = maxSize_local;
  bVar1 = boost::optional<unsigned_long_long>::operator!(maxSize_local);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_80 = std::numeric_limits<unsigned_long_long>::min();
  }
  else {
    puVar2 = boost::optional<unsigned_long_long>::operator*(maxSize_local);
    local_80 = *puVar2;
  }
  this->_minSize = local_80;
  this_local = (JsonArrayValReq *)elemValReq_local;
  bVar1 = boost::optional<unsigned_long_long>::operator!
                    ((optional<unsigned_long_long> *)elemValReq_local);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_98 = std::numeric_limits<unsigned_long_long>::max();
  }
  else {
    puVar2 = boost::optional<unsigned_long_long>::operator*
                       ((optional<unsigned_long_long> *)elemValReq_local);
    local_98 = *puVar2;
  }
  this->_maxSize = local_98;
  std::shared_ptr<const_yactfr::internal::JsonValReq>::shared_ptr(&this->_elemValReq,elemValReq);
  return;
}

Assistant:

JsonArrayValReq::JsonArrayValReq(const boost::optional<Size>& minSize,
                                 const boost::optional<Size>& maxSize,
                                 JsonValReq::Sp elemValReq) :
    JsonValReq {JsonVal::Kind::Array},
    _minSize {minSize ? *minSize : std::numeric_limits<Size>::min()},
    _maxSize {maxSize ? *maxSize : std::numeric_limits<Size>::max()},
    _elemValReq {std::move(elemValReq)}
{
}